

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_control_mobile.cc
# Opt level: O0

int32_t WebRtcAecm_Process(void *aecmInst,int16_t *nearendNoisy,int16_t *nearendClean,int16_t *out,
                          size_t nrOfSamples,int16_t msInSndCardBuf)

{
  RingBuffer *self;
  short sVar1;
  int iVar2;
  ulong uVar3;
  size_t sVar4;
  int16_t *local_160;
  undefined2 local_138;
  undefined2 local_134;
  double local_130;
  int16_t **local_120;
  int16_t *farend_ptr;
  int16_t farend [80];
  size_t nFrames;
  size_t nBlocks10ms;
  ulong uStack_58;
  short nmbrOfFilledBuffers;
  size_t i;
  int32_t retVal;
  AecMobile *aecm;
  int16_t msInSndCardBuf_local;
  size_t nrOfSamples_local;
  int16_t *out_local;
  int16_t *nearendClean_local;
  int16_t *nearendNoisy_local;
  void *aecmInst_local;
  
  i._4_4_ = 0;
  if (aecmInst == (void *)0x0) {
    aecmInst_local._4_4_ = -1;
  }
  else if (nearendNoisy == (int16_t *)0x0) {
    aecmInst_local._4_4_ = 0x2ee3;
  }
  else if (out == (int16_t *)0x0) {
    aecmInst_local._4_4_ = 0x2ee3;
  }
  else if (*(short *)((long)aecmInst + 0x150) == 0x2a) {
    if ((nrOfSamples == 0x50) || (nrOfSamples == 0xa0)) {
      if (msInSndCardBuf < 0) {
        aecm._6_2_ = 0;
        i._4_4_ = 0x2f44;
      }
      else {
        aecm._6_2_ = msInSndCardBuf;
        if (500 < msInSndCardBuf) {
          aecm._6_2_ = 500;
          i._4_4_ = 0x2f44;
        }
      }
      *(int16_t *)((long)aecmInst + 0x15a) = aecm._6_2_ + 10;
      uVar3 = (nrOfSamples / 0x50) /
              (ulong)(long)*(short *)(*(long *)((long)aecmInst + 0x180) + 0x238);
      if (*(int *)((long)aecmInst + 0x164) == 0) {
        for (uStack_58 = 0; uStack_58 < nrOfSamples / 0x50; uStack_58 = uStack_58 + 1) {
          local_120 = (int16_t **)0x0;
          sVar4 = WebRtc_available_read(*(RingBuffer **)((long)aecmInst + 0x178));
          if ((short)((short)sVar4 / 0x50) < 1) {
            memcpy(&farend_ptr,(void *)((long)aecmInst + uStack_58 * 0xa0 + 0x10),0xa0);
            local_120 = &farend_ptr;
          }
          else {
            WebRtc_ReadBuffer(*(RingBuffer **)((long)aecmInst + 0x178),&local_120,&farend_ptr,0x50);
            memcpy((void *)((long)aecmInst + uStack_58 * 0xa0 + 0x10),local_120,0xa0);
          }
          if (((uStack_58 == 0) && (*aecmInst == 8000)) ||
             ((uStack_58 == 1 && (*aecmInst == 16000)))) {
            WebRtcAecm_EstBufDelay((AecMobile *)aecmInst,*(short *)((long)aecmInst + 0x15a));
          }
          if (nearendClean == (int16_t *)0x0) {
            local_160 = (int16_t *)0x0;
          }
          else {
            local_160 = nearendClean + uStack_58 * 0x50;
          }
          iVar2 = WebRtcAecm_ProcessFrame
                            (*(AecmCore **)((long)aecmInst + 0x180),(int16_t *)local_120,
                             nearendNoisy + uStack_58 * 0x50,local_160,out + uStack_58 * 0x50);
          if (iVar2 == -1) {
            return -1;
          }
        }
      }
      else {
        if (nearendClean == (int16_t *)0x0) {
          if (out != nearendNoisy) {
            memcpy(out,nearendNoisy,nrOfSamples << 1);
          }
        }
        else if (out != nearendClean) {
          memcpy(out,nearendClean,nrOfSamples << 1);
        }
        sVar4 = WebRtc_available_read(*(RingBuffer **)((long)aecmInst + 0x178));
        sVar1 = (short)sVar4 / 0x50;
        if (*(int *)((long)aecmInst + 0x168) != 0) {
          *(short *)((long)aecmInst + 0x158) = *(short *)((long)aecmInst + 0x158) + 1;
          if (*(short *)((long)aecmInst + 0x152) == 0) {
            *(undefined2 *)((long)aecmInst + 0x156) = *(undefined2 *)((long)aecmInst + 0x15a);
            *(undefined2 *)((long)aecmInst + 0x154) = 0;
          }
          iVar2 = (int)*(short *)((long)aecmInst + 0x156) - (int)*(short *)((long)aecmInst + 0x15a);
          if (iVar2 < 1) {
            iVar2 = -iVar2;
          }
          if ((double)(int)*(short *)((long)aecmInst + 0x15a) * 0.2 <= 8.0) {
            local_130 = 8.0;
          }
          else {
            local_130 = (double)(int)*(short *)((long)aecmInst + 0x15a) * 0.2;
          }
          if (local_130 <= (double)iVar2) {
            *(undefined2 *)((long)aecmInst + 0x152) = 0;
          }
          else {
            *(short *)((long)aecmInst + 0x154) =
                 *(short *)((long)aecmInst + 0x154) + *(short *)((long)aecmInst + 0x15a);
            *(short *)((long)aecmInst + 0x152) = *(short *)((long)aecmInst + 0x152) + 1;
          }
          if (5 < (long)*(short *)((long)aecmInst + 0x152) * uVar3) {
            if ((*(short *)((long)aecmInst + 0x154) * 3 *
                (int)*(short *)(*(long *)((long)aecmInst + 0x180) + 0x238)) /
                (*(short *)((long)aecmInst + 0x152) * 0x28) < 0x32) {
              local_134 = (undefined2)
                          ((*(short *)((long)aecmInst + 0x154) * 3 *
                           (int)*(short *)(*(long *)((long)aecmInst + 0x180) + 0x238)) /
                          (*(short *)((long)aecmInst + 0x152) * 0x28));
            }
            else {
              local_134 = 0x32;
            }
            *(undefined2 *)((long)aecmInst + 8) = local_134;
            *(undefined4 *)((long)aecmInst + 0x168) = 0;
          }
          if (0x32 < (long)*(short *)((long)aecmInst + 0x158) * uVar3) {
            if ((*(short *)((long)aecmInst + 0x15a) * 3 *
                (int)*(short *)(*(long *)((long)aecmInst + 0x180) + 0x238)) / 0x28 < 0x32) {
              local_138 = (undefined2)
                          ((*(short *)((long)aecmInst + 0x15a) * 3 *
                           (int)*(short *)(*(long *)((long)aecmInst + 0x180) + 0x238)) / 0x28);
            }
            else {
              local_138 = 0x32;
            }
            *(undefined2 *)((long)aecmInst + 8) = local_138;
            *(undefined4 *)((long)aecmInst + 0x168) = 0;
          }
        }
        if (*(int *)((long)aecmInst + 0x168) == 0) {
          if (sVar1 == *(short *)((long)aecmInst + 8)) {
            *(undefined4 *)((long)aecmInst + 0x164) = 0;
          }
          else if (*(short *)((long)aecmInst + 8) < sVar1) {
            self = *(RingBuffer **)((long)aecmInst + 0x178);
            sVar4 = WebRtc_available_read(*(RingBuffer **)((long)aecmInst + 0x178));
            WebRtc_MoveReadPtr(self,(int)sVar4 + *(short *)((long)aecmInst + 8) * -0x50);
            *(undefined4 *)((long)aecmInst + 0x164) = 0;
          }
        }
      }
      aecmInst_local._4_4_ = i._4_4_;
    }
    else {
      aecmInst_local._4_4_ = 0x2ee4;
    }
  }
  else {
    aecmInst_local._4_4_ = 0x2ee2;
  }
  return aecmInst_local._4_4_;
}

Assistant:

int32_t WebRtcAecm_Process(void *aecmInst, const int16_t *nearendNoisy,
                           const int16_t *nearendClean, int16_t *out,
                           size_t nrOfSamples, int16_t msInSndCardBuf)
{
    AecMobile* aecm = static_cast<AecMobile*>(aecmInst);
    int32_t retVal = 0;
    size_t i;
    short nmbrOfFilledBuffers;
    size_t nBlocks10ms;
    size_t nFrames;
#ifdef AEC_DEBUG
    short msInAECBuf;
#endif

    if (aecm == NULL)
    {
        return -1;
    }

    if (nearendNoisy == NULL)
    {
        return AECM_NULL_POINTER_ERROR;
    }

    if (out == NULL)
    {
        return AECM_NULL_POINTER_ERROR;
    }

    if (aecm->initFlag != kInitCheck)
    {
        return AECM_UNINITIALIZED_ERROR;
    }

    if (nrOfSamples != 80 && nrOfSamples != 160)
    {
        return AECM_BAD_PARAMETER_ERROR;
    }

    if (msInSndCardBuf < 0)
    {
        msInSndCardBuf = 0;
        retVal = AECM_BAD_PARAMETER_WARNING;
    } else if (msInSndCardBuf > 500)
    {
        msInSndCardBuf = 500;
        retVal = AECM_BAD_PARAMETER_WARNING;
    }
    msInSndCardBuf += 10;
    aecm->msInSndCardBuf = msInSndCardBuf;

    nFrames = nrOfSamples / FRAME_LEN;
    nBlocks10ms = nFrames / aecm->aecmCore->mult;

    if (aecm->ECstartup)
    {
        if (nearendClean == NULL)
        {
            if (out != nearendNoisy)
            {
                memcpy(out, nearendNoisy, sizeof(short) * nrOfSamples);
            }
        } else if (out != nearendClean)
        {
            memcpy(out, nearendClean, sizeof(short) * nrOfSamples);
        }

        nmbrOfFilledBuffers =
            (short) WebRtc_available_read(aecm->farendBuf) / FRAME_LEN;
        // The AECM is in the start up mode
        // AECM is disabled until the soundcard buffer and farend buffers are OK

        // Mechanism to ensure that the soundcard buffer is reasonably stable.
        if (aecm->checkBuffSize)
        {
            aecm->checkBufSizeCtr++;
            // Before we fill up the far end buffer we require the amount of data on the
            // sound card to be stable (+/-8 ms) compared to the first value. This
            // comparison is made during the following 4 consecutive frames. If it seems
            // to be stable then we start to fill up the far end buffer.

            if (aecm->counter == 0)
            {
                aecm->firstVal = aecm->msInSndCardBuf;
                aecm->sum = 0;
            }

            if (abs(aecm->firstVal - aecm->msInSndCardBuf)
                    < WEBRTC_SPL_MAX(0.2 * aecm->msInSndCardBuf, kSampMsNb))
            {
                aecm->sum += aecm->msInSndCardBuf;
                aecm->counter++;
            } else
            {
                aecm->counter = 0;
            }

            if (aecm->counter * nBlocks10ms >= 6)
            {
                // The farend buffer size is determined in blocks of 80 samples
                // Use 75% of the average value of the soundcard buffer
                aecm->bufSizeStart
                        = WEBRTC_SPL_MIN((3 * aecm->sum
                                        * aecm->aecmCore->mult) / (aecm->counter * 40), BUF_SIZE_FRAMES);
                // buffersize has now been determined
                aecm->checkBuffSize = 0;
            }

            if (aecm->checkBufSizeCtr * nBlocks10ms > 50)
            {
                // for really bad sound cards, don't disable echocanceller for more than 0.5 sec
                aecm->bufSizeStart = WEBRTC_SPL_MIN((3 * aecm->msInSndCardBuf
                                * aecm->aecmCore->mult) / 40, BUF_SIZE_FRAMES);
                aecm->checkBuffSize = 0;
            }
        }

        // if checkBuffSize changed in the if-statement above
        if (!aecm->checkBuffSize)
        {
            // soundcard buffer is now reasonably stable
            // When the far end buffer is filled with approximately the same amount of
            // data as the amount on the sound card we end the start up phase and start
            // to cancel echoes.

            if (nmbrOfFilledBuffers == aecm->bufSizeStart)
            {
                aecm->ECstartup = 0; // Enable the AECM
            } else if (nmbrOfFilledBuffers > aecm->bufSizeStart)
            {
                WebRtc_MoveReadPtr(aecm->farendBuf,
                                   (int) WebRtc_available_read(aecm->farendBuf)
                                   - (int) aecm->bufSizeStart * FRAME_LEN);
                aecm->ECstartup = 0;
            }
        }

    } else
    {
        // AECM is enabled

        // Note only 1 block supported for nb and 2 blocks for wb
        for (i = 0; i < nFrames; i++)
        {
            int16_t farend[FRAME_LEN];
            const int16_t* farend_ptr = NULL;

            nmbrOfFilledBuffers =
                (short) WebRtc_available_read(aecm->farendBuf) / FRAME_LEN;

            // Check that there is data in the far end buffer
            if (nmbrOfFilledBuffers > 0)
            {
                // Get the next 80 samples from the farend buffer
                WebRtc_ReadBuffer(aecm->farendBuf, (void**) &farend_ptr, farend,
                                  FRAME_LEN);

                // Always store the last frame for use when we run out of data
                memcpy(&(aecm->farendOld[i][0]), farend_ptr,
                       FRAME_LEN * sizeof(short));
            } else
            {
                // We have no data so we use the last played frame
                memcpy(farend, &(aecm->farendOld[i][0]), FRAME_LEN * sizeof(short));
                farend_ptr = farend;
            }

            // Call buffer delay estimator when all data is extracted,
            // i,e. i = 0 for NB and i = 1 for WB
            if ((i == 0 && aecm->sampFreq == 8000) || (i == 1 && aecm->sampFreq == 16000))
            {
                WebRtcAecm_EstBufDelay(aecm, aecm->msInSndCardBuf);
            }

            // Call the AECM
            /*WebRtcAecm_ProcessFrame(aecm->aecmCore, farend, &nearend[FRAME_LEN * i],
             &out[FRAME_LEN * i], aecm->knownDelay);*/
            if (WebRtcAecm_ProcessFrame(aecm->aecmCore,
                                        farend_ptr,
                                        &nearendNoisy[FRAME_LEN * i],
                                        (nearendClean
                                         ? &nearendClean[FRAME_LEN * i]
                                         : NULL),
                                        &out[FRAME_LEN * i]) == -1)
                return -1;
        }
    }

#ifdef AEC_DEBUG
    msInAECBuf = (short) WebRtc_available_read(aecm->farendBuf) /
        (kSampMsNb * aecm->aecmCore->mult);
    fwrite(&msInAECBuf, 2, 1, aecm->bufFile);
    fwrite(&(aecm->knownDelay), sizeof(aecm->knownDelay), 1, aecm->delayFile);
#endif

    return retVal;
}